

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_ssse3.h
# Opt level: O0

void shuffle_filter_ssse3(int16_t *filter,__m128i *f)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i alVar7;
  __m128i f_values;
  __m128i *f_local;
  int16_t *filter_local;
  
  auVar6 = *(undefined1 (*) [16])filter;
  auVar5 = *(undefined1 (*) [16])filter;
  auVar1 = *(undefined1 (*) [16])filter;
  auVar4._8_8_ = 0x200020002000200;
  auVar4._0_8_ = 0x200020002000200;
  alVar7 = (__m128i)pshufb(*(undefined1 (*) [16])filter,auVar4);
  *f = alVar7;
  auVar3._8_8_ = 0x604060406040604;
  auVar3._0_8_ = 0x604060406040604;
  alVar7 = (__m128i)pshufb(auVar1,auVar3);
  f[1] = alVar7;
  auVar2._8_8_ = 0xa080a080a080a08;
  auVar2._0_8_ = 0xa080a080a080a08;
  alVar7 = (__m128i)pshufb(auVar5,auVar2);
  f[2] = alVar7;
  auVar1._8_8_ = 0xe0c0e0c0e0c0e0c;
  auVar1._0_8_ = 0xe0c0e0c0e0c0e0c;
  alVar7 = (__m128i)pshufb(auVar6,auVar1);
  f[3] = alVar7;
  return;
}

Assistant:

static inline void shuffle_filter_ssse3(const int16_t *const filter,
                                        __m128i *const f) {
  const __m128i f_values = _mm_load_si128((const __m128i *)filter);
  // pack and duplicate the filter values
  f[0] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0200u));
  f[1] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0604u));
  f[2] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0a08u));
  f[3] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0e0cu));
}